

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_compute_branch(DisasContext_conflict14 *ctx,uint32_t opc,int r1,int r2,int32_t constant,
                       int32_t offset)

{
  uint32_t uVar1;
  uint uVar2;
  TCGContext_conflict9 *s;
  uintptr_t o;
  TCGTemp *pTVar3;
  TCGTemp *a1;
  TCGv_i32 pTVar4;
  TCGLabel *pTVar5;
  TCGv_i32 pTVar6;
  target_ulong_conflict tVar7;
  TCGv_i32 r1_00;
  TCGCond TVar8;
  TCGContext_conflict9 *pTVar9;
  uintptr_t o_9;
  TCGContext_conflict9 *tcg_ctx;
  short address;
  int iVar10;
  uintptr_t o_8;
  TCGTemp *args [1];
  TCGTemp *local_60;
  TCGv_i32 local_58;
  TCGContext_conflict9 *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s = ctx->uc->tcg_ctx;
  address = (short)offset;
  if (0x8d < (int)opc) {
    if ((int)opc < 0xdc) {
      if ((int)opc < 0xae) {
        if ((int)opc < 0x9e) {
          if (opc == 0x8e) {
            local_60 = (TCGTemp *)s->cpu_gpr_d[(uint)r1];
            pTVar4 = tcg_const_i32_tricore(s,0);
            pTVar9 = ctx->uc->tcg_ctx;
            pTVar5 = gen_new_label_tricore(pTVar9);
            TVar8 = TCG_COND_LE;
            goto LAB_00d2b116;
          }
          if (opc == 0x9d) goto LAB_00d2af49;
        }
        else {
          if (opc == 0x9e) {
            local_60 = (TCGTemp *)s->cpu_gpr_d[0xf];
            pTVar4 = tcg_const_i32_tricore(s,constant);
            pTVar9 = ctx->uc->tcg_ctx;
            pTVar5 = gen_new_label_tricore(pTVar9);
            TVar8 = TCG_COND_EQ;
            goto LAB_00d2ae9f;
          }
          if (opc == 0x9f) {
            pTVar3 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
            pTVar6 = (TCGv_i32)((long)pTVar3 - (long)s);
            pTVar4 = s->cpu_gpr_d[(uint)r1];
            if ((int)ctx->opcode < 0) {
              if (pTVar4 != pTVar6) {
                tcg_gen_op2_tricore(s,INDEX_op_mov_i32,(TCGArg)pTVar3,(TCGArg)(pTVar4 + (long)s));
              }
              tcg_gen_subi_i32_tricore(s,s->cpu_gpr_d[(uint)r1],s->cpu_gpr_d[(uint)r1],1);
            }
            else {
              if (pTVar4 != pTVar6) {
                tcg_gen_op2_tricore(s,INDEX_op_mov_i32,(TCGArg)pTVar3,(TCGArg)(pTVar4 + (long)s));
              }
              tcg_gen_addi_i32_tricore(s,s->cpu_gpr_d[(uint)r1],s->cpu_gpr_d[(uint)r1],1);
            }
            gen_branch_condi(ctx,TCG_COND_NE,pTVar6,constant,address);
            goto LAB_00d2b47c;
          }
        }
        goto switchD_00d2a7b1_caseD_60;
      }
      switch(opc) {
      case 0xbc:
        local_60 = (TCGTemp *)s->cpu_gpr_a[(uint)r1];
        goto LAB_00d2af9f;
      case 0xbd:
        pTVar4 = s->cpu_gpr_a[(uint)r1];
        if ((int)ctx->opcode < 0) {
          TVar8 = TCG_COND_NE;
        }
        else {
          TVar8 = TCG_COND_EQ;
        }
        constant = 0;
        break;
      case 0xbe:
        pTVar4 = s->cpu_gpr_d[(uint)r1];
        pTVar6 = s->cpu_gpr_d[0xf];
        pTVar5 = gen_new_label_tricore(s);
        TVar8 = TCG_COND_EQ;
        goto LAB_00d2b231;
      case 0xbf:
        if ((int)ctx->opcode < 0) {
          constant = ctx->opcode >> 0xc & 0xf;
          pTVar4 = s->cpu_gpr_d[(uint)r1];
          TVar8 = TCG_COND_LTU;
        }
        else {
          pTVar4 = s->cpu_gpr_d[(uint)r1];
          TVar8 = TCG_COND_LT;
        }
        break;
      default:
        if (opc == 0xae) {
          local_60 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
          pTVar4 = (TCGv_i32)((long)local_60 - (long)s);
          tcg_gen_andi_i32_tricore(s,pTVar4,s->cpu_gpr_d[0xf],1 << ((byte)constant & 0x1f));
          local_50 = ctx->uc->tcg_ctx;
          local_58 = tcg_const_i32_tricore(local_50,0);
          pTVar9 = ctx->uc->tcg_ctx;
          pTVar5 = gen_new_label_tricore(pTVar9);
          TVar8 = TCG_COND_NE;
LAB_00d2b31d:
          tcg_gen_brcond_i32_tricore(pTVar9,TVar8,pTVar4,local_58,pTVar5);
          gen_goto_tb(ctx,1,ctx->pc_succ_insn);
          *(byte *)pTVar5 = *(byte *)pTVar5 | 1;
          tcg_gen_op1_tricore(pTVar9,INDEX_op_set_label,(TCGArg)pTVar5);
          gen_goto_tb(ctx,0,address * 2 + (ctx->base).pc_next);
          tcg_temp_free_internal_tricore(local_50,(TCGTemp *)(local_58 + (long)local_50));
          goto LAB_00d2b167;
        }
        if (opc != 0xce) goto switchD_00d2a7b1_caseD_60;
        local_60 = (TCGTemp *)s->cpu_gpr_d[(uint)r1];
        pTVar4 = tcg_const_i32_tricore(s,0);
        pTVar9 = ctx->uc->tcg_ctx;
        pTVar5 = gen_new_label_tricore(pTVar9);
        TVar8 = TCG_COND_GE;
        goto LAB_00d2b116;
      }
LAB_00d2b4eb:
      gen_branch_condi(ctx,TVar8,pTVar4,constant,address);
      goto LAB_00d2b4f0;
    }
    if (0xed < (int)opc) {
      switch(opc) {
      case 0xf6:
        local_60 = (TCGTemp *)s->cpu_gpr_d[(uint)r1];
LAB_00d2b0e6:
        constant = 0;
        goto LAB_00d2b0f0;
      case 0xf7:
      case 0xf8:
      case 0xf9:
      case 0xfa:
      case 0xfb:
        break;
      case 0xfc:
        iVar10 = offset * 2 + -0x20;
        r2 = r1;
        goto LAB_00d2af37;
      case 0xfd:
        if ((int)ctx->opcode < 0) goto LAB_00d2b036;
        iVar10 = offset * 2;
LAB_00d2af37:
        gen_loop(ctx,r2,iVar10);
        goto LAB_00d2b4f0;
      case 0xfe:
        pTVar4 = s->cpu_gpr_d[(uint)r1];
        pTVar6 = s->cpu_gpr_d[0xf];
        pTVar5 = gen_new_label_tricore(s);
        TVar8 = TCG_COND_NE;
LAB_00d2b231:
        tcg_gen_brcond_i32_tricore(s,TVar8,pTVar4,pTVar6,pTVar5);
        gen_goto_tb(ctx,1,ctx->pc_succ_insn);
        *(byte *)pTVar5 = *(byte *)pTVar5 | 1;
        tcg_gen_op1_tricore(s,INDEX_op_set_label,(TCGArg)pTVar5);
        iVar10 = offset * 0x10000 + 0x100000 >> 0xf;
        goto LAB_00d2b272;
      case 0xff:
        if ((int)ctx->opcode < 0) {
          constant = ctx->opcode >> 0xc & 0xf;
          pTVar4 = s->cpu_gpr_d[(uint)r1];
          TVar8 = TCG_COND_GEU;
        }
        else {
          pTVar4 = s->cpu_gpr_d[(uint)r1];
          TVar8 = TCG_COND_GE;
        }
        goto LAB_00d2b4eb;
      default:
        if (opc == 0xee) {
          local_60 = (TCGTemp *)s->cpu_gpr_d[0xf];
          goto LAB_00d2b0e6;
        }
      }
      goto switchD_00d2a7b1_caseD_60;
    }
    switch(opc) {
    case 0xdc:
      tcg_gen_andi_i32_tricore(s,s->cpu_PC,s->cpu_gpr_a[(uint)r1],-2);
LAB_00d2aa5a:
      tcg_gen_exit_tb_tricore(s,(TranslationBlock *)0x0,0);
      goto LAB_00d2b4f0;
    case 0xdd:
      tcg_gen_op2_tricore(s,INDEX_op_movi_i32,(TCGArg)(s->cpu_gpr_a[0xb] + (long)s),
                          (long)(int)ctx->pc_succ_insn);
      goto LAB_00d2af49;
    case 0xde:
      local_60 = (TCGTemp *)s->cpu_gpr_d[0xf];
      pTVar4 = tcg_const_i32_tricore(s,constant);
      pTVar9 = ctx->uc->tcg_ctx;
      pTVar5 = gen_new_label_tricore(pTVar9);
      TVar8 = TCG_COND_NE;
LAB_00d2ae9f:
      tcg_gen_brcond_i32_tricore(pTVar9,TVar8,(TCGv_i32)local_60,pTVar4,pTVar5);
      gen_goto_tb(ctx,1,ctx->pc_succ_insn);
      *(byte *)pTVar5 = *(byte *)pTVar5 | 1;
      tcg_gen_op1_tricore(pTVar9,INDEX_op_set_label,(TCGArg)pTVar5);
      tVar7 = (offset * 0x10000 + 0x100000 >> 0xf) + (ctx->base).pc_next;
      goto LAB_00d2b159;
    case 0xdf:
      pTVar4 = s->cpu_gpr_d[(uint)r1];
      if ((int)ctx->opcode < 0) {
        TVar8 = TCG_COND_NE;
      }
      else {
        TVar8 = TCG_COND_EQ;
      }
      goto LAB_00d2b4eb;
    case 0xe1:
      gen_fcall_save_ctx(ctx);
LAB_00d2af49:
      tVar7 = (offset & 0xf00000U) * 0x100 + (offset & 0xfffffU) * 2;
      goto LAB_00d2b27e;
    default:
      if (opc == 0xed) {
        pTVar4 = tcg_const_i32_tricore(s,ctx->pc_succ_insn);
        local_48 = (TCGTemp *)(s->cpu_env + (long)s);
        local_40 = (TCGTemp *)(pTVar4 + (long)s);
        tcg_gen_callN_tricore(s,helper_call,(TCGTemp *)0x0,2,&local_48);
        tcg_temp_free_internal_tricore(s,(TCGTemp *)(pTVar4 + (long)s));
        goto LAB_00d2af49;
      }
    case 0xe0:
switchD_00d2a7b1_caseD_60:
      pTVar4 = tcg_const_i32_tricore(s,2);
      pTVar6 = tcg_const_i32_tricore(s,1);
      pTVar9 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar9,INDEX_op_movi_i32,(TCGArg)(pTVar9->cpu_PC + (long)pTVar9),
                          (long)(int)(ctx->base).pc_next);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      local_60 = (TCGTemp *)(pTVar6 + (long)s);
      local_40 = (TCGTemp *)(pTVar4 + (long)s);
      local_38 = local_60;
      tcg_gen_callN_tricore(s,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_48);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(s,(TCGTemp *)(pTVar4 + (long)s));
    }
    goto LAB_00d2b167;
  }
  if ((int)opc < 0x4e) {
    if ((int)opc < 0x1f) {
      if (0xd < (int)opc) {
        if (opc == 0xe) {
          local_60 = (TCGTemp *)s->cpu_gpr_d[(uint)r1];
          pTVar4 = tcg_const_i32_tricore(s,0);
          pTVar9 = ctx->uc->tcg_ctx;
          pTVar5 = gen_new_label_tricore(pTVar9);
          TVar8 = TCG_COND_LT;
          goto LAB_00d2b116;
        }
        if (opc == 0x1d) goto LAB_00d2b036;
        if (opc != 0x1e) goto switchD_00d2a7b1_caseD_60;
        local_60 = (TCGTemp *)s->cpu_gpr_d[0xf];
        goto LAB_00d2afa9;
      }
      if ((opc == 6) || (opc == 9)) {
        local_48 = (TCGTemp *)(s->cpu_env + (long)s);
        tcg_gen_callN_tricore(s,helper_ret,(TCGTemp *)0x0,1,&local_48);
        goto LAB_00d2aa5a;
      }
    }
    else if ((int)opc < 0x3c) {
      if (opc == 0x1f) {
        pTVar3 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
        r1_00 = (TCGv_i32)((long)pTVar3 - (long)s);
        a1 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
        pTVar6 = (TCGv_i32)((long)a1 - (long)s);
        pTVar4 = s->cpu_gpr_d[(uint)r1];
        if ((int)ctx->opcode < 0) {
          if (pTVar4 != r1_00) {
            tcg_gen_op2_tricore(s,INDEX_op_mov_i32,(TCGArg)pTVar3,(TCGArg)(pTVar4 + (long)s));
          }
          if (s->cpu_gpr_d[(uint)r2] != pTVar6) {
            tcg_gen_op2_tricore(s,INDEX_op_mov_i32,(TCGArg)a1,
                                (TCGArg)(s->cpu_gpr_d[(uint)r2] + (long)s));
          }
          tcg_gen_subi_i32_tricore(s,s->cpu_gpr_d[(uint)r1],s->cpu_gpr_d[(uint)r1],1);
        }
        else {
          if (pTVar4 != r1_00) {
            tcg_gen_op2_tricore(s,INDEX_op_mov_i32,(TCGArg)pTVar3,(TCGArg)(pTVar4 + (long)s));
          }
          if (s->cpu_gpr_d[(uint)r2] != pTVar6) {
            tcg_gen_op2_tricore(s,INDEX_op_mov_i32,(TCGArg)a1,
                                (TCGArg)(s->cpu_gpr_d[(uint)r2] + (long)s));
          }
          tcg_gen_addi_i32_tricore(s,s->cpu_gpr_d[(uint)r1],s->cpu_gpr_d[(uint)r1],1);
        }
        gen_branch_cond(ctx,TCG_COND_NE,r1_00,pTVar6,address);
        tcg_temp_free_internal_tricore(s,(TCGTemp *)(r1_00 + (long)s));
LAB_00d2b47c:
        local_60 = (TCGTemp *)(pTVar6 + (long)s);
        goto LAB_00d2b167;
      }
      if (opc == 0x2e) {
        local_60 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
        pTVar4 = (TCGv_i32)((long)local_60 - (long)s);
        tcg_gen_andi_i32_tricore(s,pTVar4,s->cpu_gpr_d[0xf],1 << ((byte)constant & 0x1f));
        local_50 = ctx->uc->tcg_ctx;
        local_58 = tcg_const_i32_tricore(local_50,0);
        pTVar9 = ctx->uc->tcg_ctx;
        pTVar5 = gen_new_label_tricore(pTVar9);
        TVar8 = TCG_COND_EQ;
        goto LAB_00d2b31d;
      }
    }
    else {
      if (opc == 0x3c) goto LAB_00d2b036;
      if (opc == 0x3e) {
        pTVar4 = s->cpu_gpr_d[(uint)r1];
        pTVar6 = s->cpu_gpr_d[0xf];
        pTVar5 = gen_new_label_tricore(s);
        TVar8 = TCG_COND_EQ;
        goto LAB_00d2b196;
      }
      if (opc == 0x3f) {
        pTVar4 = s->cpu_gpr_d[(uint)r1];
        pTVar6 = s->cpu_gpr_d[(uint)r2];
        if ((int)ctx->opcode < 0) {
          TVar8 = TCG_COND_LTU;
        }
        else {
          TVar8 = TCG_COND_LT;
        }
        goto LAB_00d2b4be;
      }
    }
    goto switchD_00d2a7b1_caseD_60;
  }
  switch(opc) {
  case 0x5c:
  case 0x6d:
    pTVar4 = tcg_const_i32_tricore(s,ctx->pc_succ_insn);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    local_40 = (TCGTemp *)(pTVar4 + (long)s);
    tcg_gen_callN_tricore(s,helper_call,(TCGTemp *)0x0,2,&local_48);
    tcg_temp_free_internal_tricore(s,(TCGTemp *)(pTVar4 + (long)s));
    break;
  case 0x5d:
    tcg_gen_op2_tricore(s,INDEX_op_movi_i32,(TCGArg)(s->cpu_gpr_a[0xb] + (long)s),
                        (long)(int)ctx->pc_succ_insn);
    break;
  case 0x5e:
    local_60 = (TCGTemp *)s->cpu_gpr_d[0xf];
LAB_00d2b0f0:
    pTVar4 = tcg_const_i32_tricore(s,constant);
    pTVar9 = ctx->uc->tcg_ctx;
    pTVar5 = gen_new_label_tricore(pTVar9);
    TVar8 = TCG_COND_NE;
    goto LAB_00d2b116;
  case 0x5f:
    uVar1 = ctx->opcode;
    pTVar4 = s->cpu_gpr_d[(uint)r1];
    pTVar6 = s->cpu_gpr_d[(uint)r2];
joined_r0x00d2b0c4:
    if ((int)uVar1 < 0) {
      TVar8 = TCG_COND_NE;
    }
    else {
      TVar8 = TCG_COND_EQ;
    }
LAB_00d2b4be:
    gen_branch_cond(ctx,TVar8,pTVar4,pTVar6,address);
    goto LAB_00d2b4f0;
  case 0x60:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
    goto switchD_00d2a7b1_caseD_60;
  case 0x61:
    gen_fcall_save_ctx(ctx);
    break;
  case 0x6e:
    local_60 = (TCGTemp *)s->cpu_gpr_d[0xf];
LAB_00d2af9f:
    constant = 0;
LAB_00d2afa9:
    pTVar4 = tcg_const_i32_tricore(s,constant);
    pTVar9 = ctx->uc->tcg_ctx;
    pTVar5 = gen_new_label_tricore(pTVar9);
    TVar8 = TCG_COND_EQ;
LAB_00d2b116:
    tcg_gen_brcond_i32_tricore(pTVar9,TVar8,(TCGv_i32)local_60,pTVar4,pTVar5);
    gen_goto_tb(ctx,1,ctx->pc_succ_insn);
    *(byte *)pTVar5 = *(byte *)pTVar5 | 1;
    tcg_gen_op1_tricore(pTVar9,INDEX_op_set_label,(TCGArg)pTVar5);
    tVar7 = address * 2 + (ctx->base).pc_next;
LAB_00d2b159:
    gen_goto_tb(ctx,0,tVar7);
    local_60 = (TCGTemp *)(pTVar4 + (long)s);
LAB_00d2b167:
    tcg_temp_free_internal_tricore(s,local_60);
    goto LAB_00d2b4f0;
  case 0x6f:
    uVar2 = ctx->opcode;
    local_60 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
    tcg_gen_andi_i32_tricore
              (s,(TCGv_i32)((long)local_60 - (long)s),s->cpu_gpr_d[(uint)r1],
               1 << ((byte)(uVar2 >> 3) & 0x10 | (byte)(uVar2 >> 0xc) & 0xf));
    gen_branch_condi(ctx,~ctx->opcode >> 0x1f ^ TCG_COND_NE,(TCGv_i32)((long)local_60 - (long)s),0,
                     address);
    goto LAB_00d2b167;
  default:
    switch(opc) {
    case 0x76:
      local_60 = (TCGTemp *)s->cpu_gpr_d[(uint)r1];
      goto LAB_00d2af9f;
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
    case 0x7b:
      break;
    case 0x7c:
      local_60 = (TCGTemp *)s->cpu_gpr_a[(uint)r1];
      goto LAB_00d2b0e6;
    case 0x7d:
      uVar1 = ctx->opcode;
      pTVar4 = s->cpu_gpr_a[(uint)r1];
      pTVar6 = s->cpu_gpr_a[(uint)r2];
      goto joined_r0x00d2b0c4;
    case 0x7e:
      pTVar4 = s->cpu_gpr_d[(uint)r1];
      pTVar6 = s->cpu_gpr_d[0xf];
      pTVar5 = gen_new_label_tricore(s);
      TVar8 = TCG_COND_NE;
LAB_00d2b196:
      tcg_gen_brcond_i32_tricore(s,TVar8,pTVar4,pTVar6,pTVar5);
      gen_goto_tb(ctx,1,ctx->pc_succ_insn);
      *(byte *)pTVar5 = *(byte *)pTVar5 | 1;
      tcg_gen_op1_tricore(s,INDEX_op_set_label,(TCGArg)pTVar5);
      tVar7 = address * 2 + (ctx->base).pc_next;
      goto LAB_00d2b27e;
    case 0x7f:
      pTVar4 = s->cpu_gpr_d[(uint)r1];
      pTVar6 = s->cpu_gpr_d[(uint)r2];
      if ((int)ctx->opcode < 0) {
        TVar8 = TCG_COND_GEU;
      }
      else {
        TVar8 = TCG_COND_GE;
      }
      goto LAB_00d2b4be;
    default:
      if (opc == 0x4e) {
        local_60 = (TCGTemp *)s->cpu_gpr_d[(uint)r1];
        pTVar4 = tcg_const_i32_tricore(s,0);
        pTVar9 = ctx->uc->tcg_ctx;
        pTVar5 = gen_new_label_tricore(pTVar9);
        TVar8 = TCG_COND_GT;
        goto LAB_00d2b116;
      }
    }
    goto switchD_00d2a7b1_caseD_60;
  }
LAB_00d2b036:
  iVar10 = offset * 2;
LAB_00d2b272:
  tVar7 = iVar10 + (ctx->base).pc_next;
LAB_00d2b27e:
  gen_goto_tb(ctx,0,tVar7);
LAB_00d2b4f0:
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_compute_branch(DisasContext *ctx, uint32_t opc,
                               int insn_bytes,
                               int rs, int rt, int32_t offset,
                               int delayslot_size)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btgt = -1;
    int blink = 0;
    int bcond_compute = 0;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
#ifdef MIPS_DEBUG_DISAS
        LOG_DISAS("Branch in delay / forbidden slot at PC 0x"
                  TARGET_FMT_lx "\n", ctx->base.pc_next);
#endif
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    /* Load needed operands */
    switch (opc) {
    case OPC_BEQ:
    case OPC_BEQL:
    case OPC_BNE:
    case OPC_BNEL:
        /* Compare two registers */
        if (rs != rt) {
            gen_load_gpr(tcg_ctx, t0, rs);
            gen_load_gpr(tcg_ctx, t1, rt);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BGEZ:
    case OPC_BGEZAL:
    case OPC_BGEZALL:
    case OPC_BGEZL:
    case OPC_BGTZ:
    case OPC_BGTZL:
    case OPC_BLEZ:
    case OPC_BLEZL:
    case OPC_BLTZ:
    case OPC_BLTZAL:
    case OPC_BLTZALL:
    case OPC_BLTZL:
        /* Compare to zero */
        if (rs != 0) {
            gen_load_gpr(tcg_ctx, t0, rs);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BPOSGE32:
#if defined(TARGET_MIPS64)
    case OPC_BPOSGE64:
        tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->cpu_dspctrl, 0x7F);
#else
        tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->cpu_dspctrl, 0x3F);
#endif
        bcond_compute = 1;
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_J:
    case OPC_JAL:
    case OPC_JALX:
        /* Jump to immediate */
        btgt = ((ctx->base.pc_next + insn_bytes) & (int32_t)0xF0000000) |
            (uint32_t)offset;
        break;
    case OPC_JR:
    case OPC_JALR:
        /* Jump to register */
        if (offset != 0 && offset != 16) {
            /*
             * Hint = 0 is JR/JALR, hint 16 is JR.HB/JALR.HB, the
             * others are reserved.
             */
            MIPS_INVAL("jump hint");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
        gen_load_gpr(tcg_ctx, tcg_ctx->btarget, rs);
        break;
    default:
        MIPS_INVAL("branch/jump");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
    if (bcond_compute == 0) {
        /* No condition to be computed */
        switch (opc) {
        case OPC_BEQ:     /* rx == rx        */
        case OPC_BEQL:    /* rx == rx likely */
        case OPC_BGEZ:    /* 0 >= 0          */
        case OPC_BGEZL:   /* 0 >= 0 likely   */
        case OPC_BLEZ:    /* 0 <= 0          */
        case OPC_BLEZL:   /* 0 <= 0 likely   */
            /* Always take */
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BGEZAL:  /* 0 >= 0          */
        case OPC_BGEZALL: /* 0 >= 0 likely   */
            /* Always take and link */
            blink = 31;
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BNE:     /* rx != rx        */
        case OPC_BGTZ:    /* 0 > 0           */
        case OPC_BLTZ:    /* 0 < 0           */
            /* Treat as NOP. */
            goto out;
        case OPC_BLTZAL:  /* 0 < 0           */
            /*
             * Handle as an unconditional branch to get correct delay
             * slot checking.
             */
            blink = 31;
            btgt = ctx->base.pc_next + insn_bytes + delayslot_size;
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BLTZALL: /* 0 < 0 likely */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 8);
            /* Skip the instruction in the delay slot */
            ctx->base.pc_next += 4;
            goto out;
        case OPC_BNEL:    /* rx != rx likely */
        case OPC_BGTZL:   /* 0 > 0 likely */
        case OPC_BLTZL:   /* 0 < 0 likely */
            /* Skip the instruction in the delay slot */
            ctx->base.pc_next += 4;
            goto out;
        case OPC_J:
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_JALX:
            ctx->hflags |= MIPS_HFLAG_BX;
            /* Fallthrough */
        case OPC_JAL:
            blink = 31;
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_JR:
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        case OPC_JALR:
            blink = rt;
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        default:
            MIPS_INVAL("branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    } else {
        switch (opc) {
        case OPC_BEQ:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BEQL:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->bcond, t0, t1);
            goto likely;
        case OPC_BNE:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BNEL:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, t0, t1);
            goto likely;
        case OPC_BGEZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BGEZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BGEZAL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            blink = 31;
            goto not_likely;
        case OPC_BGEZALL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            blink = 31;
            goto likely;
        case OPC_BGTZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GT, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BGTZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GT, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BLEZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LE, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BLEZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LE, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BLTZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BLTZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BPOSGE32:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 32);
            goto not_likely;
#if defined(TARGET_MIPS64)
        case OPC_BPOSGE64:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 64);
            goto not_likely;
#endif
        case OPC_BLTZAL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            blink = 31;
        not_likely:
            ctx->hflags |= MIPS_HFLAG_BC;
            break;
        case OPC_BLTZALL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            blink = 31;
        likely:
            ctx->hflags |= MIPS_HFLAG_BL;
            break;
        default:
            MIPS_INVAL("conditional branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    }

    ctx->btarget = btgt;

    switch (delayslot_size) {
    case 2:
        ctx->hflags |= MIPS_HFLAG_BDS16;
        break;
    case 4:
        ctx->hflags |= MIPS_HFLAG_BDS32;
        break;
    }

    if (blink > 0) {
        int post_delay = insn_bytes + delayslot_size;
        int lowbit = !!(ctx->hflags & MIPS_HFLAG_M16);

        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[blink],
                        ctx->base.pc_next + post_delay + lowbit);
    }

 out:
    if (insn_bytes == 2) {
        ctx->hflags |= MIPS_HFLAG_B16;
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}